

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O0

string * prepareEvalExpr(string *__return_storage_ptr__,string *eval)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  string local_48 [8];
  string newString;
  int local_20;
  value_type ch;
  int i;
  int lastIndex;
  string *eval_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_20 = std::__cxx11::string::size();
    do {
      local_20 = local_20 + -1;
      if (local_20 < 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)eval);
        return __return_storage_ptr__;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)eval);
      newString.field_2._M_local_buf[0xf] = *pcVar3;
    } while ((((newString.field_2._M_local_buf[0xf] < '\x01') ||
              (iVar1 = isalnum((int)newString.field_2._M_local_buf[0xf]), iVar1 != 0)) ||
             (newString.field_2._M_local_buf[0xf] == '_')) ||
            (newString.field_2._M_local_buf[0xf] != ':'));
    std::__cxx11::string::string(local_48,(string *)eval);
    puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_48);
    *puVar4 = 0x2e;
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)eval);
    std::__cxx11::string::~string(local_48);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)eval);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prepareEvalExpr(const std::string& eval)
{
	if (eval.empty())
	{
		return eval;
	}

	int lastIndex = static_cast<int>(eval.size() - 1);

	for (int i = lastIndex; i >= 0; i--)
	{
		auto ch = eval[i];
		if (ch > 0)
		{
			if (!isalnum(ch) && ch != '_')
			{
				if (ch == ':')
				{
					auto newString = eval;
					newString[i] = '.';
					return eval;
				}
			}
		}
	}
	return eval;
}